

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double uniform_01_sample(int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0x7fffffff;
  if (*seed != 0) {
    iVar4 = *seed;
  }
  iVar2 = iVar4 + 0xffff;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar1 = (iVar4 % 0x10000) * 0x41a7;
  iVar4 = iVar1 + 0xffff;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  iVar3 = (iVar2 >> 0x10) * 0x41a7;
  iVar2 = (iVar4 >> 0x10) + iVar3;
  iVar4 = (iVar4 >> 0x10) + iVar3 + 0x7fff;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  iVar1 = iVar1 % 0x10000 + iVar2 * 0x10000 + (iVar4 >> 0xf);
  iVar4 = (iVar4 >> 0xf) * -0x80000000;
  iVar2 = iVar4 + iVar1 + -0x7fffffff;
  iVar4 = iVar1 + iVar4;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  *seed = iVar4;
  return (double)iVar4 * 4.656612875e-10;
}

Assistant:

double uniform_01_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_01_SAMPLE is a random number generator.
//
//  Discussion:
//
//    SEED = SEED * (7^5) mod (2^31 - 1)
//    UNIFORM_01_SAMPLE = SEED * / ( 2^31 - 1 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, the integer "seed" used to generate
//    the output random number, and updated in preparation for the
//    next one.  SEED should not be zero.
//
//    Output, double UNIFORM_01_SAMPLE, a random value between 0 and 1.
//
//  Local Parameters:
//
//    Local, int IA = 7^5.
//
//    Local, int IB = 2^15.
//
//    Local, int IB16 = 2^16.
//
//    Local, int IP = 2^31 - 1.
//
{
  static int ia = 16807;
  static int ib15 = 32768;
  static int ib16 = 65536;
  static int ip = 2147483647;
  int iprhi;
  int ixhi;
  int k;
  int leftlo;
  int loxa;
  double temp;
//
//  Don't let SEED be 0.
//
  if ( seed == 0 )
  {
    seed = ip;
  }
//
//  Get the 15 high order bits of SEED.
//
  ixhi = seed / ib16;
//
//  Get the 16 low bits of SEED and form the low product.
//
  loxa = ( seed - ixhi * ib16 ) * ia;
//
//  Get the 15 high order bits of the low product.
//
  leftlo = loxa / ib16;
//
//  Form the 31 highest bits of the full product.
//
  iprhi = ixhi * ia + leftlo;
//
//  Get overflow past the 31st bit of full product.
//
  k = iprhi / ib15;
//
//  Assemble all the parts and presubtract IP.  The parentheses are essential.
//
  seed = ( ( ( loxa - leftlo * ib16 ) - ip ) +
    ( iprhi - k * ib15 ) * ib16 ) + k;
//
//  Add IP back in if necessary.
//
  if ( seed < 0 )
  {
    seed = seed + ip;
  }
//
//  Multiply by 1 / (2^31-1).
//
  temp = static_cast< double > ( seed) * 4.656612875E-10;

  return temp;
}